

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder-helper.c
# Opt level: O0

int tlv_check_type_length(uint8_t *buf,size_t buflen,uint32_t type)

{
  uint8_t *puVar1;
  uint8_t *ptr;
  uint32_t local_28;
  uint32_t real_len;
  uint32_t real_type;
  uint32_t type_local;
  size_t buflen_local;
  uint8_t *buf_local;
  
  if (buf == (uint8_t *)0x0) {
    buf_local._4_4_ = -0x10;
  }
  else {
    real_len = type;
    _real_type = buflen;
    buflen_local = (size_t)buf;
    puVar1 = tlv_get_type_length(buf,buflen,&local_28,(uint32_t *)((long)&ptr + 4));
    if (puVar1 == (uint8_t *)0x0) {
      buf_local._4_4_ = -0xe;
    }
    else if (local_28 == real_len) {
      if ((ulong)ptr._4_4_ == _real_type - ((long)puVar1 - buflen_local)) {
        buf_local._4_4_ = 0;
      }
      else {
        buf_local._4_4_ = -0xd;
      }
    }
    else {
      buf_local._4_4_ = -0xc;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
tlv_check_type_length(uint8_t* buf, size_t buflen, uint32_t type){
  uint32_t real_type, real_len;
  uint8_t* ptr;

  if(buf == NULL){
    return NDN_INVALID_POINTER;
  }
  ptr = tlv_get_type_length(buf, buflen, &real_type, &real_len);
  if(ptr == NULL){
    return NDN_OVERSIZE_VAR;
  }
  if(real_type != type){
    return NDN_WRONG_TLV_TYPE;
  }
  if(real_len != buflen - (ptr - buf)){
    return NDN_WRONG_TLV_LENGTH;
  }
  return NDN_SUCCESS;
}